

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.cpp
# Opt level: O2

bool __thiscall
duckdb::QueryResultChunkScanState::InternalLoad(QueryResultChunkScanState *this,ErrorData *error)

{
  bool bVar1;
  StreamQueryResult *this_00;
  QueryResult *this_01;
  
  this_01 = this->result;
  if ((this_01->super_BaseQueryResult).type == STREAM_RESULT) {
    this_00 = QueryResult::Cast<duckdb::StreamQueryResult>(this_01);
    bVar1 = StreamQueryResult::IsOpen(this_00);
    if (!bVar1) {
      return true;
    }
    this_01 = this->result;
  }
  bVar1 = QueryResult::TryFetch(this_01,&(this->super_ChunkScanState).current_chunk,error);
  return bVar1;
}

Assistant:

bool QueryResultChunkScanState::InternalLoad(ErrorData &error) {
	D_ASSERT(!finished);
	if (result.type == QueryResultType::STREAM_RESULT) {
		auto &stream_result = result.Cast<StreamQueryResult>();
		if (!stream_result.IsOpen()) {
			return true;
		}
	}
	return result.TryFetch(current_chunk, error);
}